

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O3

Stream * rw::writeMesh(Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  undefined4 *puVar1;
  bool bVar2;
  void *pvVar3;
  int32 j;
  ulong uVar4;
  long *plVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  MeshStream ms;
  MeshHeaderStream mhs;
  int32 indbuf [256];
  undefined4 local_460;
  int32 local_45c;
  MaterialList *local_458;
  void *local_450;
  undefined4 local_444;
  uint local_440;
  undefined4 local_43c;
  uint local_438 [258];
  
  puVar1 = *(undefined4 **)((long)object + 0x90);
  local_444 = *puVar1;
  local_440 = (uint)*(ushort *)(puVar1 + 1);
  local_43c = puVar1[2];
  Stream::write32(stream,&local_444,0xc);
  if (*(short *)(*(long *)((long)object + 0x90) + 4) != 0) {
    plVar5 = (long *)(*(long *)((long)object + 0x90) + 0x10);
    local_458 = (MaterialList *)((long)object + 0x80);
    uVar6 = 0;
    local_450 = object;
    do {
      pvVar3 = local_450;
      local_460 = (undefined4)plVar5[1];
      local_45c = MaterialList::findIndex(local_458,(Material *)plVar5[2]);
      Stream::write32(stream,&local_460,8);
      if ((*(byte *)((long)pvVar3 + 0x13) & 1) == 0) {
        if (0 < (int)*(uint *)(plVar5 + 1)) {
          lVar9 = *plVar5;
          uVar8 = *(uint *)(plVar5 + 1);
          do {
            uVar7 = 0x100;
            if (uVar8 < 0x100) {
              uVar7 = (ulong)uVar8;
            }
            uVar4 = 0;
            do {
              local_438[uVar4] = (uint)*(ushort *)(lVar9 + uVar4 * 2);
              uVar4 = uVar4 + 1;
            } while (uVar4 < uVar7);
            Stream::write32(stream,local_438,(int)uVar7 * 4);
            lVar9 = lVar9 + uVar7 * 2;
            bVar2 = 0x100 < (int)uVar8;
            uVar8 = uVar8 - 0x100;
          } while (bVar2);
        }
      }
      else if (**(int **)((long)pvVar3 + 0x98) == 0xb) {
        Stream::write16(stream,(void *)*plVar5,(int)plVar5[1] * 2);
      }
      plVar5 = plVar5 + 3;
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(ushort *)(*(long *)((long)local_450 + 0x90) + 4));
  }
  return stream;
}

Assistant:

static Stream*
writeMesh(Stream *stream, int32, void *object, int32, int32)
{
	MeshHeaderStream mhs;
	MeshStream ms;
	int32 indbuf[256];
	Geometry *geo = (Geometry*)object;
	mhs.flags = geo->meshHeader->flags;
	mhs.numMeshes = geo->meshHeader->numMeshes;
	mhs.totalIndices = geo->meshHeader->totalIndices;
	stream->write32(&mhs, sizeof(MeshHeaderStream));
	Mesh *mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < geo->meshHeader->numMeshes; i++){
		ms.numIndices = mesh->numIndices;
		ms.matIndex = geo->matList.findIndex(mesh->material);
		stream->write32(&ms, sizeof(MeshStream));
		if(geo->flags & Geometry::NATIVE){
			assert(geo->instData != nil);
			if(geo->instData->platform == PLATFORM_WDGL)
				stream->write16(mesh->indices,
				            mesh->numIndices*2);
		}else{
			uint16 *ind = mesh->indices;
			int32 numIndices = mesh->numIndices;
			for(; numIndices > 0; numIndices -= 256){
				int32 n = numIndices < 256 ? numIndices : 256;
				for(int32 j = 0; j < n; j++)
					indbuf[j] = ind[j];
				stream->write32(indbuf, n*4);
				ind += n;
			}
		}
		mesh++;
	}
	return stream;
}